

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive_impl.h
# Opt level: O0

void test_exhaustive_ellswift(secp256k1_context *ctx,secp256k1_ge *group)

{
  int iVar1;
  uchar *in_RSI;
  secp256k1_context *in_RDI;
  secp256k1_ge ge_decoded;
  secp256k1_pubkey pub_decoded;
  uchar ell64 [64];
  uchar sec32 [32];
  secp256k1_scalar scalar_i;
  int i;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  secp256k1_ge *in_stack_fffffffffffffee0;
  secp256k1_context *in_stack_fffffffffffffee8;
  secp256k1_ge *in_stack_ffffffffffffff00;
  secp256k1_ge *in_stack_ffffffffffffff08;
  uchar *in_stack_ffffffffffffff98;
  secp256k1_pubkey *in_stack_ffffffffffffffa0;
  secp256k1_context *in_stack_ffffffffffffffa8;
  uchar *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  iVar2 = 1;
  while( true ) {
    if (0xc < iVar2) {
      return;
    }
    secp256k1_scalar_set_int
              ((secp256k1_scalar *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    secp256k1_scalar_get_b32
              ((uchar *)in_stack_fffffffffffffee0,
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    iVar1 = secp256k1_ellswift_create
                      (in_RDI,in_RSI,(uchar *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe0);
    if (iVar1 == 0) break;
    secp256k1_ellswift_decode
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    secp256k1_pubkey_load
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               (secp256k1_pubkey *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    iVar1 = secp256k1_ge_eq_var(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/ellswift/tests_exhaustive_impl.h"
              ,0x23,"test condition failed: secp256k1_ge_eq_var(&ge_decoded, &group[i])");
      abort();
    }
    iVar2 = iVar2 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/ellswift/tests_exhaustive_impl.h"
          ,0x1e,"test condition failed: secp256k1_ellswift_create(ctx, ell64, sec32, NULL)");
  abort();
}

Assistant:

static void test_exhaustive_ellswift(const secp256k1_context *ctx, const secp256k1_ge *group) {
    int i;

    /* Note that SwiftEC/ElligatorSwift are inherently curve operations, not
     * group operations, and this test only checks the curve points which are in
     * a tiny subgroup. In that sense it can't be really seen as exhaustive as
     * it doesn't (and for computational reasons obviously cannot) test the
     * entire domain ellswift operates under. */
    for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
        secp256k1_scalar scalar_i;
        unsigned char sec32[32];
        unsigned char ell64[64];
        secp256k1_pubkey pub_decoded;
        secp256k1_ge ge_decoded;

        /* Construct ellswift pubkey from exhaustive loop scalar i. */
        secp256k1_scalar_set_int(&scalar_i, i);
        secp256k1_scalar_get_b32(sec32, &scalar_i);
        CHECK(secp256k1_ellswift_create(ctx, ell64, sec32, NULL));

        /* Decode ellswift pubkey and check that it matches the precomputed group element. */
        secp256k1_ellswift_decode(ctx, &pub_decoded, ell64);
        secp256k1_pubkey_load(ctx, &ge_decoded, &pub_decoded);
        CHECK(secp256k1_ge_eq_var(&ge_decoded, &group[i]));
    }
}